

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O3

Fra_Man_t * Fra_ManStart(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  Fra_Man_t *pFVar3;
  uint *puVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Fra_Cla_t *pFVar7;
  Aig_Obj_t **__s;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  pFVar3 = (Fra_Man_t *)calloc(1,0x158);
  pFVar3->pPars = pPars;
  pFVar3->pManAig = pManAig;
  iVar1 = pManAig->vObjs->nSize;
  pFVar3->nSizeAlloc = iVar1;
  lVar10 = (long)pPars->nFramesK + 1;
  iVar9 = (int)lVar10;
  pFVar3->nFramesAll = iVar9;
  uVar8 = (pManAig->nObjs[2] - pManAig->nRegs) * iVar9 + pManAig->nRegs;
  iVar2 = (((int)uVar8 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0);
  pFVar3->nPatWords = iVar2;
  puVar4 = (uint *)malloc((long)iVar2 << 2);
  pFVar3->pPatWords = puVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pFVar3->vPiVars = pVVar5;
  pFVar7 = Fra_ClassesStart(pManAig);
  pFVar3->pCla = pFVar7;
  __s = (Aig_Obj_t **)malloc(lVar10 * iVar1 * 8);
  pFVar3->pMemFraig = __s;
  memset(__s,0,(long)iVar9 * (long)iVar1 * 8);
  Aig_ManRandom(1);
  pVVar5 = pManAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      if (pVVar5->pArray[lVar10] != (void *)0x0) {
        *(Fra_Man_t **)((long)pVVar5->pArray[lVar10] + 0x28) = pFVar3;
        pManAig = pFVar3->pManAig;
      }
      lVar10 = lVar10 + 1;
      pVVar5 = pManAig->vObjs;
    } while (lVar10 < pVVar5->nSize);
  }
  return pFVar3;
}

Assistant:

Fra_Man_t * Fra_ManStart( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // allocate the fraiging manager
    p = ABC_ALLOC( Fra_Man_t, 1 );
    memset( p, 0, sizeof(Fra_Man_t) );
    p->pPars      = pPars;
    p->pManAig    = pManAig;
    p->nSizeAlloc = Aig_ManObjNumMax( pManAig );
    p->nFramesAll = pPars->nFramesK + 1;
    // allocate storage for sim pattern
    p->nPatWords  = Abc_BitWordNum( (Aig_ManCiNum(pManAig) - Aig_ManRegNum(pManAig)) * p->nFramesAll + Aig_ManRegNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // equivalence classes
    p->pCla       = Fra_ClassesStart( pManAig );
    // allocate other members
    p->pMemFraig  = ABC_ALLOC( Aig_Obj_t *, p->nSizeAlloc * p->nFramesAll );
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    // set random number generator
//    srand( 0xABCABC );
    Aig_ManRandom(1);
    // set the pointer to the manager
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->pData = p;
    return p;
}